

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_WeightedAverageHash::Matches
          (ON_WeightedAverageHash *this,ON_WeightedAverageHash *b,ON_Xform *bt,double tol)

{
  double dVar1;
  double dist;
  ON_3dPoint bi;
  double dStack_40;
  int i;
  double minDist;
  double maxDist;
  double tol_local;
  ON_Xform *bt_local;
  ON_WeightedAverageHash *b_local;
  ON_WeightedAverageHash *this_local;
  
  minDist = 0.0;
  dStack_40 = 1.79769313486232e+308;
  for (bi.z._4_4_ = 0; bi.z._4_4_ < 5; bi.z._4_4_ = bi.z._4_4_ + 1) {
    ON_Xform::operator*((ON_3dPoint *)&dist,bt,b->m_sum + bi.z._4_4_);
    dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&dist,this->m_sum + bi.z._4_4_);
    if (minDist < dVar1) {
      minDist = dVar1;
    }
    if (dVar1 < dStack_40) {
      dStack_40 = dVar1;
    }
  }
  return minDist <= tol;
}

Assistant:

bool ON_WeightedAverageHash::Matches(const ON_WeightedAverageHash& b, const ON_Xform& bt, double tol) const
{
  double maxDist = 0.0;
  double minDist = DBL_MAX;
  for (int i = 0; i < ON_WeightedAverageHash::dim; i++)
  {
    const ON_3dPoint bi = bt * b.m_sum[i];
    const double dist = bi.DistanceTo(m_sum[i]);
    if (maxDist < dist)
      maxDist = dist;
    if (minDist > dist)
      minDist = dist;
  }
  if (maxDist <= tol)
    return true;
  else
    return false;
}